

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webrtc_vad.c
# Opt level: O0

int WebRtcVad_ValidRateAndFrameLength(int rate,size_t frame_length)

{
  size_t valid_length;
  ulong uStack_28;
  int valid_length_ms;
  size_t i;
  int return_value;
  size_t frame_length_local;
  int rate_local;
  
  uStack_28 = 0;
  while( true ) {
    if (3 < uStack_28) {
      return -1;
    }
    if (kValidRates[uStack_28] == rate) break;
    uStack_28 = uStack_28 + 1;
  }
  valid_length._4_4_ = 10;
  while( true ) {
    if (0x1e < valid_length._4_4_) {
      return -1;
    }
    if (frame_length == (long)((kValidRates[uStack_28] / 1000) * valid_length._4_4_)) break;
    valid_length._4_4_ = valid_length._4_4_ + 10;
  }
  return 0;
}

Assistant:

int WebRtcVad_ValidRateAndFrameLength(int rate, size_t frame_length) {
  int return_value = -1;
  size_t i;
  int valid_length_ms;
  size_t valid_length;

  // We only allow 10, 20 or 30 ms frames. Loop through valid frame rates and
  // see if we have a matching pair.
  for (i = 0; i < kRatesSize; i++) {
    if (kValidRates[i] == rate) {
      for (valid_length_ms = 10; valid_length_ms <= kMaxFrameLengthMs;
          valid_length_ms += 10) {
        valid_length = (size_t)(kValidRates[i] / 1000 * valid_length_ms);
        if (frame_length == valid_length) {
          return_value = 0;
          break;
        }
      }
      break;
    }
  }

  return return_value;
}